

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_38e3a9::NoexceptSpec::printLeft(NoexceptSpec *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  
  R.Last = "";
  R.First = "noexcept(";
  OutputStream::operator+=(S,R);
  Node::print(this->E,S);
  R_00.Last = "";
  R_00.First = ")";
  OutputStream::operator+=(S,R_00);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "noexcept(";
    E->print(S);
    S += ")";
  }